

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream * QtPrivate::readArrayBasedContainer<QList<QPointF>>(QDataStream *s,QList<QPointF> *c)

{
  Status SVar1;
  qint64 qVar2;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype n;
  qint64 size;
  value_type t;
  StreamStateSaver stateSaver;
  parameter_type in_stack_ffffffffffffff98;
  StreamStateSaver *in_stack_ffffffffffffffa0;
  QDataStream *local_30;
  QPointF local_28;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver
            (in_stack_ffffffffffffffa0,(QDataStream *)in_stack_ffffffffffffff98);
  QList<QPointF>::clear((QList<QPointF> *)in_stack_ffffffffffffffa0);
  qVar2 = QDataStream::readQSizeType((QDataStream *)in_stack_ffffffffffffffa0);
  if (qVar2 < 0) {
    QDataStream::setStatus((Status)in_RDI);
    local_30 = in_RDI;
  }
  else {
    QList<QPointF>::reserve((QList<QPointF> *)in_RDI,i);
    for (in_stack_ffffffffffffffa0 = (StreamStateSaver *)0x0; local_30 = in_RDI,
        (long)in_stack_ffffffffffffffa0 < qVar2;
        in_stack_ffffffffffffffa0 =
             (StreamStateSaver *)((long)&((DataPointer *)&in_stack_ffffffffffffffa0->stream)->d + 1)
        ) {
      local_28.xp = -NAN;
      local_28.yp = -NAN;
      QPointF::QPointF(&local_28);
      ::operator>>(in_RDI,(QPointF *)&local_28);
      SVar1 = QDataStream::status(in_RDI);
      if (SVar1 != Ok) {
        QList<QPointF>::clear((QList<QPointF> *)in_stack_ffffffffffffffa0);
        local_30 = in_RDI;
        break;
      }
      QList<QPointF>::append((QList<QPointF> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  StreamStateSaver::~StreamStateSaver(in_stack_ffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}